

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Offset<reflection::Enum> __thiscall
flatbuffers::EnumDef::Serialize(EnumDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  string *psVar1;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> OVar2;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  Offset<flatbuffers::String> declaration_file;
  Offset<reflection::Enum> OVar3;
  pointer ppEVar4;
  allocator<char> local_91;
  Offset<reflection::Type> local_90;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>_> local_8c;
  string decl_file_in_project;
  string qualified_name;
  vector<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  enumval_offsets;
  
  enumval_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  enumval_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  enumval_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppEVar4 = (this->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 !=
      (this->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar4 = ppEVar4 + 1) {
    qualified_name._M_dataplus._M_p._0_4_ = EnumVal::Serialize(*ppEVar4,builder,parser);
    std::
    vector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>
    ::emplace_back<flatbuffers::Offset<reflection::EnumVal>>
              ((vector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>
                *)&enumval_offsets,(Offset<reflection::EnumVal> *)&qualified_name);
  }
  Namespace::GetFullyQualifiedName
            (&qualified_name,(this->super_Definition).defined_namespace,(string *)this,1000);
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,&qualified_name);
  OVar2 = FlatBufferBuilderImpl<false>::
          CreateVector<flatbuffers::Offset<reflection::EnumVal>,std::allocator<flatbuffers::Offset<reflection::EnumVal>>>
                    (builder,&enumval_offsets);
  local_90 = Type::Serialize(&this->underlying_type,builder);
  local_8c = OVar2;
  attributes = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  documentation.o = 0;
  if (((parser->opts).binary_schema_comments == true) &&
     ((this->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    documentation =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  psVar1 = (this->super_Definition).declaration_file;
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&decl_file_in_project,"",&local_91)
    ;
  }
  else {
    std::__cxx11::string::string((string *)&decl_file_in_project,(string *)psVar1);
  }
  declaration_file =
       FlatBufferBuilderImpl<false>::CreateSharedString
                 (builder,decl_file_in_project._M_dataplus._M_p,
                  decl_file_in_project._M_string_length);
  OVar3 = reflection::CreateEnum
                    (builder,name,local_8c,this->is_union,local_90,attributes,documentation,
                     declaration_file);
  std::__cxx11::string::~string((string *)&decl_file_in_project);
  std::__cxx11::string::~string((string *)&qualified_name);
  std::
  _Vector_base<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
  ::~_Vector_base(&enumval_offsets.
                   super__Vector_base<flatbuffers::Offset<reflection::EnumVal>,_std::allocator<flatbuffers::Offset<reflection::EnumVal>_>_>
                 );
  return (Offset<reflection::Enum>)OVar3.o;
}

Assistant:

Offset<reflection::Enum> EnumDef::Serialize(FlatBufferBuilder *builder,
                                            const Parser &parser) const {
  std::vector<Offset<reflection::EnumVal>> enumval_offsets;
  for (auto it = vals.vec.begin(); it != vals.vec.end(); ++it) {
    enumval_offsets.push_back((*it)->Serialize(builder, parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto vals__ = builder->CreateVector(enumval_offsets);
  const auto type__ = underlying_type.Serialize(builder);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateEnum(*builder, name__, vals__, is_union, type__,
                                attr__, docs__, file__);
}